

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  server_t s;
  string local_3c8;
  _Any_data local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Any_data local_388;
  code *local_378;
  code *pcStack_370;
  _Any_data local_368;
  code *local_358;
  code *pcStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  code *local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  code *local_318;
  undefined8 uStack_310;
  server_t local_300;
  
  clask::server_t::server_t(&local_300);
  clask::logger::default_level = 2;
  local_3a8._M_unused._M_object = &local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"/files","");
  paVar1 = &local_3c8.field_2;
  local_3c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"./files","");
  clask::server_t::static_dir(&local_300,(string *)&local_3a8,&local_3c8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_unused._0_8_ != &local_398) {
    operator_delete(local_3a8._M_unused._M_object,local_398._M_allocated_capacity + 1);
  }
  local_3a8._M_unused._M_object = &local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"/","");
  local_3c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"./public","");
  clask::server_t::static_dir(&local_300,(string *)&local_3a8,&local_3c8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_unused._0_8_ != &local_398) {
    operator_delete(local_3a8._M_unused._M_object,local_398._M_allocated_capacity + 1);
  }
  local_3c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/api","");
  local_328 = 0;
  uStack_320 = 0;
  local_398._M_allocated_capacity = 0;
  local_398._8_8_ = 0;
  local_3a8._M_unused._M_object = (void *)0x0;
  local_3a8._8_8_ = 0;
  pcStack_370 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/upload/main.cxx:32:17)>
                ::_M_invoke;
  local_388._M_unused._M_object = (void *)0x0;
  local_388._8_8_ = 0;
  local_378 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/upload/main.cxx:32:17)>
              ::_M_manager;
  local_318 = (code *)0x0;
  uStack_310 = 0;
  local_368._M_unused._M_object = (void *)0x0;
  local_368._8_8_ = 0;
  local_358 = (code *)0x0;
  pcStack_350 = (code *)0x0;
  clask::server_t::parse_tree(&local_300,&local_300.treeGET,&local_3c8,(func_t *)&local_3a8);
  if (local_358 != (code *)0x0) {
    (*local_358)(&local_368,&local_368,__destroy_functor);
  }
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,__destroy_functor);
  }
  if ((code *)local_398._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_398._M_allocated_capacity)(&local_3a8,&local_3a8,3);
  }
  if (local_318 != (code *)0x0) {
    (*local_318)(&local_328,&local_328,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  local_3c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"/upload","");
  local_348 = 0;
  uStack_340 = 0;
  local_378 = (code *)0x0;
  pcStack_370 = (code *)0x0;
  local_388._M_unused._M_object = (void *)0x0;
  local_388._8_8_ = 0;
  local_398._M_allocated_capacity = 0;
  local_398._8_8_ = 0;
  local_3a8._M_unused._M_object = (void *)0x0;
  local_3a8._8_8_ = 0;
  pcStack_350 = std::
                _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/upload/main.cxx:42:21)>
                ::_M_invoke;
  local_368._M_unused._M_object = (void *)0x0;
  local_368._8_8_ = 0;
  local_358 = std::
              _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/upload/main.cxx:42:21)>
              ::_M_manager;
  local_338 = (code *)0x0;
  uStack_330 = 0;
  clask::server_t::parse_tree(&local_300,&local_300.treePOST,&local_3c8,(func_t *)&local_3a8);
  if (local_358 != (code *)0x0) {
    (*local_358)(&local_368,&local_368,__destroy_functor);
  }
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,__destroy_functor);
  }
  if ((code *)local_398._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_398._M_allocated_capacity)(&local_3a8,&local_3a8,3);
  }
  if (local_338 != (code *)0x0) {
    (*local_338)(&local_348,&local_348,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  local_3a8._8_8_ = 0;
  local_398._M_allocated_capacity = local_398._M_allocated_capacity & 0xffffffffffffff00;
  local_3a8._M_unused._M_object = &local_398;
  clask::server_t::_run(&local_300,(string *)&local_3a8,0x1f90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_unused._0_8_ != &local_398) {
    operator_delete(local_3a8._M_unused._M_object,local_398._M_allocated_capacity + 1);
  }
  clask::server_t::~server_t(&local_300);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();
  s.log.default_level = clask::log_level::INFO;
  s.static_dir("/files", "./files");
  s.static_dir("/", "./public");
  s.GET("/api", [](clask::request&) {
    nlohmann::json data;
    int n = 0;
    for (const auto& e : std::filesystem::directory_iterator("files")) {
      auto fn = e.path().filename().u8string();
      if (fn[0] == '.') continue;
      data[n++] = fn;
    }
    return data.dump();
  });
  s.POST("/upload", [](clask::request& req) -> clask::response {
    std::vector<clask::part> parts;
    if (req.header_value("expect") == "100-continue") {
      return clask::response {
        .code = 100,
      };
    }
    if (!req.parse_multipart(parts) || parts.size() == 0) {
      return clask::response {
        .code = 400,
        .content = "Bad Request",
      };
    }
    for (auto part : parts) {
      if (!save_file(part)) {
        return clask::response {
          .code = 400,
          .content = "Bad Request",
        };
      }
    }
    return clask::response {
      .code = 302,
      .content = "",
      .headers = {
        {"Location", "/"},
      },
    };
  });
  s.run();
}